

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenOperator(Lexer *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 __args;
  __type _Var2;
  short sVar3;
  Lexer *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  TokenType operatorType;
  string op;
  undefined1 local_7a [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_7a._0_2_ = 0;
  sVar3 = 0;
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_7a + 10);
  local_7a._2_8_ = this;
  while( true ) {
    std::operator+(__return_storage_ptr__,&local_50,(char)in_RSI->currentChar);
    if (local_70._M_string_length - 4 < 0xfffffffffffffffd) break;
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             (KEYWORDS_abi_cxx11_ + local_70._M_string_length * 0x18 + 0x98);
    pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (KEYWORDS_abi_cxx11_ + local_70._M_string_length * 0x18 + 0xa0);
    while( true ) {
      if (__lhs == pbVar1) goto LAB_001090e0;
      _Var2 = std::operator==(__lhs,__return_storage_ptr__);
      if (_Var2) break;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &__lhs[1]._M_string_length;
    }
    sVar3 = *(short *)&__lhs[1]._M_dataplus._M_p;
    local_7a._0_2_ = sVar3;
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)&local_50);
    nextChar(in_RSI);
  }
LAB_001090e0:
  std::__cxx11::string::~string((string *)(local_7a + 10));
  __args = local_7a._2_8_;
  if (local_50._M_string_length == 0) {
    *(_func_int ***)local_7a._2_8_ = (_func_int **)0x0;
    goto LAB_0010915d;
  }
  if (sVar3 == 0x52) {
    if (in_RSI->currentChar == 0x2f) {
      nextLineComment((Lexer *)local_7a._2_8_);
      goto LAB_0010915d;
    }
    if (in_RSI->currentChar == 0x2a) {
      nextRegionComment((Lexer *)local_7a._2_8_);
      goto LAB_0010915d;
    }
  }
  getCurrentCursor((Position *)(local_7a + 10),in_RSI);
  std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType&,pfederc::Position>
            ((Token **)__args,(TokenType *)&in_RSI->currentToken,(Position *)local_7a);
LAB_0010915d:
  std::__cxx11::string::~string((string *)&local_50);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)__args;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenOperator() noexcept {
  std::string op;
  TokenType operatorType = TokenType::TOK_ERR;
  while (_hasOperatorStr(op + (char) currentChar, operatorType)) {
    op += (char) currentChar;
    nextChar();
  }
  // no match
  if (op.empty())
    return nullptr;

  // if match check if comment (starting with '/')
  if (operatorType == TokenType::TOK_OP_DIV) {
    if (currentChar == '*') // region comment
      return nextRegionComment();
    else if (currentChar == '/') // one line comment
      return nextLineComment();
  }

  return std::make_unique<Token>(currentToken, operatorType, getCurrentCursor());
}